

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O1

Type * __thiscall
QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_>::operator*
          (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>_> *this
          )

{
  int iVar1;
  
  if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>>::instance()
      ::holder == '\0') {
    iVar1 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>>
                                 ::instance()::holder);
    if (iVar1 != 0) {
      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>>::instance()
      ::holder._0_8_ = 0;
      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>>::instance()
      ::holder._8_8_ = 0;
      QReadWriteLock::QReadWriteLock
                ((QReadWriteLock *)
                 QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>>
                 ::instance()::holder,NonRecursive);
      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>>::instance()
      ::holder._8_8_ = 0;
      QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>::guard._q_value.
      super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0xff;
      __cxa_atexit(QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>::~Holder,
                   QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>>
                   ::instance()::holder,&__dso_handle);
      __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>>
                           ::instance()::holder);
    }
  }
  return (Type *)QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dirSearchPaths>>
                 ::instance()::holder;
}

Assistant:

static Type *instance() noexcept(Holder::ConstructionIsNoexcept)
    {
        static Holder holder;
        return holder.pointer();
    }